

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  iVar2 = isxdigit((uint)this->_currdata);
  if (iVar2 == 0) {
    (*this->_errfunc)(this->_errtarget,"hexadecimal number expected");
  }
  lVar3 = 0;
  while( true ) {
    bVar1 = this->_currdata;
    iVar2 = isxdigit((uint)bVar1);
    if ((iVar2 == 0) || (maxdigits <= lVar3)) break;
    dest[lVar3] = bVar1;
    lVar3 = lVar3 + 1;
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
  }
  dest[lVar3] = '\0';
  return lVar3;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR)) Error(_SC("hexadecimal number expected"));
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}